

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfailure.h
# Opt level: O0

void __thiscall
UnitTests::TestFailure::TestFailure
          (TestFailure *this,string *msg,string *file,int line,string *failure_type,int error_code)

{
  string local_98 [32];
  UnitTests local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [36];
  int local_34;
  string *psStack_30;
  int error_code_local;
  string *failure_type_local;
  string *psStack_20;
  int line_local;
  string *file_local;
  string *msg_local;
  TestFailure *this_local;
  
  local_34 = error_code;
  psStack_30 = failure_type;
  failure_type_local._4_4_ = line;
  psStack_20 = file;
  file_local = msg;
  msg_local = (string *)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__TestFailure_00140d40;
  std::__cxx11::string::string(local_98,(string *)file);
  FormatError(local_78,(string *)local_98,failure_type_local._4_4_,local_34);
  std::operator+(local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78);
  std::operator+(&this->m_what,local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::string((string *)&this->m_msg,(string *)msg);
  return;
}

Assistant:

TestFailure(std::string msg, std::string file, int line, std::string failure_type, int error_code)
            : m_what(FormatError(std::move(file), line, error_code) + std::move(failure_type) + std::move(msg)),
              m_msg(std::move(msg))
        {
        }